

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::ConfigFileNamesAndGenex
          (cmQtAutoGenInitializer *this,ConfigString *configString,string *genex,string_view prefix,
          string_view suffix)

{
  basic_string_view<char,_std::char_traits<char>_> local_58;
  static_string_view local_48;
  string local_38;
  
  local_58._M_str = prefix._M_str;
  local_58._M_len = prefix._M_len;
  ConfigFileNames(this,configString,prefix,suffix);
  if (this->MultiConfig == true) {
    local_48.super_string_view._M_len = 10;
    local_48.super_string_view._M_str = "_$<CONFIG>";
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>const&>
              (&local_38,&local_58,&local_48,&suffix);
    std::__cxx11::string::operator=((string *)genex,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  std::__cxx11::string::_M_assign((string *)genex);
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNamesAndGenex(
  ConfigString& configString, std::string& genex, cm::string_view const prefix,
  cm::string_view const suffix)
{
  this->ConfigFileNames(configString, prefix, suffix);
  if (this->MultiConfig) {
    genex = cmStrCat(prefix, "_$<CONFIG>"_s, suffix);
  } else {
    genex = configString.Default;
  }
}